

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Base.cpp
# Opt level: O1

void __thiscall
adios2::format::BP5Base::BP5BitfieldSet(BP5Base *this,BP5MetadataInfoStruct *MBase,int Bit)

{
  size_t *psVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(long)Bit >> 6;
  if (MBase->BitFieldCount <= uVar2) {
    psVar1 = (size_t *)realloc(MBase->BitField,uVar2 * 8 + 8);
    MBase->BitField = psVar1;
    memset(psVar1 + MBase->BitFieldCount,0,(uVar2 - MBase->BitFieldCount) * 8 + 8);
    MBase->BitFieldCount = uVar2 + 1;
  }
  MBase->BitField[uVar2] = MBase->BitField[uVar2] | 1L << ((byte)Bit & 0x3f);
  return;
}

Assistant:

void BP5Base::BP5BitfieldSet(struct BP5MetadataInfoStruct *MBase, int Bit) const
{
    size_t Element = Bit / (sizeof(size_t) * 8);
    int ElementBit = Bit % (sizeof(size_t) * 8);
    if (static_cast<size_t>(Element) >= MBase->BitFieldCount)
    {
        MBase->BitField = (size_t *)realloc(MBase->BitField, sizeof(size_t) * (Element + 1));
        memset(MBase->BitField + MBase->BitFieldCount, 0,
               (Element - MBase->BitFieldCount + 1) * sizeof(size_t));
        MBase->BitFieldCount = Element + 1;
    }
    MBase->BitField[Element] |= ((size_t)1 << ElementBit);
}